

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void __thiscall
fmt::v11::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,emphasis em)

{
  bool bVar1;
  emphasis in_SIL;
  long lVar2;
  long in_RDI;
  size_t i;
  size_t index;
  uint8_t em_codes [8];
  ulong local_28;
  long local_20;
  char local_11 [17];
  
  local_11[8] = in_SIL;
  memset(local_11,0,8);
  bVar1 = has_emphasis(local_11[8],bold);
  if (bVar1) {
    local_11[0] = '\x01';
  }
  bVar1 = has_emphasis(local_11[8],faint);
  if (bVar1) {
    local_11[1] = 2;
  }
  bVar1 = has_emphasis(local_11[8],italic);
  if (bVar1) {
    local_11[2] = 3;
  }
  bVar1 = has_emphasis(local_11[8],underline);
  if (bVar1) {
    local_11[3] = 4;
  }
  bVar1 = has_emphasis(local_11[8],blink);
  if (bVar1) {
    local_11[4] = 5;
  }
  bVar1 = has_emphasis(local_11[8],reverse);
  if (bVar1) {
    local_11[5] = 7;
  }
  bVar1 = has_emphasis(local_11[8],conceal);
  if (bVar1) {
    local_11[6] = 8;
  }
  bVar1 = has_emphasis(local_11[8],strikethrough);
  if (bVar1) {
    local_11[7] = 9;
  }
  local_20 = 0;
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    if (local_11[local_28] != '\0') {
      *(undefined1 *)(in_RDI + local_20) = 0x1b;
      *(undefined1 *)(in_RDI + local_20 + 1) = 0x5b;
      lVar2 = local_20 + 3;
      *(char *)(in_RDI + local_20 + 2) = local_11[local_28] + '0';
      local_20 = local_20 + 4;
      *(undefined1 *)(in_RDI + lVar2) = 0x6d;
    }
  }
  *(undefined1 *)(in_RDI + local_20) = 0;
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(emphasis em) noexcept {
    uint8_t em_codes[num_emphases] = {};
    if (has_emphasis(em, emphasis::bold)) em_codes[0] = 1;
    if (has_emphasis(em, emphasis::faint)) em_codes[1] = 2;
    if (has_emphasis(em, emphasis::italic)) em_codes[2] = 3;
    if (has_emphasis(em, emphasis::underline)) em_codes[3] = 4;
    if (has_emphasis(em, emphasis::blink)) em_codes[4] = 5;
    if (has_emphasis(em, emphasis::reverse)) em_codes[5] = 7;
    if (has_emphasis(em, emphasis::conceal)) em_codes[6] = 8;
    if (has_emphasis(em, emphasis::strikethrough)) em_codes[7] = 9;

    size_t index = 0;
    for (size_t i = 0; i < num_emphases; ++i) {
      if (!em_codes[i]) continue;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');
      buffer[index++] = static_cast<Char>('0' + em_codes[i]);
      buffer[index++] = static_cast<Char>('m');
    }
    buffer[index++] = static_cast<Char>(0);
  }